

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::type_to_array_glsl_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this,SPIRType *type,uint32_t variable_id)

{
  BaseType BVar1;
  bool bVar2;
  SPIRType *type_00;
  char (*in_R8) [2];
  SPIRVariable *local_68;
  allocator local_35;
  uint32_t local_34;
  SPIRVariable *local_30;
  SPIRVariable *var;
  SPIRType *pSStack_20;
  uint32_t variable_id_local;
  SPIRType *type_local;
  CompilerMSL *this_local;
  
  BVar1 = type->basetype;
  var._4_4_ = variable_id;
  pSStack_20 = type;
  type_local = (SPIRType *)this;
  this_local = (CompilerMSL *)__return_storage_ptr__;
  if ((BVar1 == AtomicCounter) || (BVar1 == RayQuery || BVar1 == ControlPointArray)) {
    CompilerGLSL::type_to_array_glsl_abi_cxx11_
              (__return_storage_ptr__,&this->super_CompilerGLSL,type,variable_id);
  }
  else {
    bVar2 = Compiler::type_is_array_of_pointers((Compiler *)this,type);
    if ((bVar2) || (bVar2 = using_builtin_array(this), bVar2)) {
      if (var._4_4_ == 0) {
        local_68 = (SPIRVariable *)0x0;
      }
      else {
        local_68 = Compiler::get<spirv_cross::SPIRVariable>((Compiler *)this,var._4_4_);
      }
      local_30 = local_68;
      if ((local_68 != (SPIRVariable *)0x0) &&
         ((local_68->storage == StorageClassUniform ||
          (local_68->storage == StorageClassStorageBuffer)))) {
        type_00 = Compiler::get_variable_data_type((Compiler *)this,local_68);
        bVar2 = Compiler::is_array((Compiler *)this,type_00);
        if (bVar2) {
          local_34 = get_resource_array_size(this,pSStack_20,var._4_4_);
          join<char_const(&)[2],unsigned_int,char_const(&)[2]>
                    (__return_storage_ptr__,(spirv_cross *)0x48521e,(char (*) [2])&local_34,
                     (uint *)0x490482,in_R8);
          return __return_storage_ptr__;
        }
      }
      CompilerGLSL::type_to_array_glsl_abi_cxx11_
                (__return_storage_ptr__,&this->super_CompilerGLSL,pSStack_20,var._4_4_);
    }
    else {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)__return_storage_ptr__,"",&local_35);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_35);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerMSL::type_to_array_glsl(const SPIRType &type, uint32_t variable_id)
{
	// Allow Metal to use the array<T> template to make arrays a value type
	switch (type.basetype)
	{
	case SPIRType::AtomicCounter:
	case SPIRType::ControlPointArray:
	case SPIRType::RayQuery:
		return CompilerGLSL::type_to_array_glsl(type, variable_id);

	default:
		if (type_is_array_of_pointers(type) || using_builtin_array())
		{
			const SPIRVariable *var = variable_id ? &get<SPIRVariable>(variable_id) : nullptr;
			if (var && (var->storage == StorageClassUniform || var->storage == StorageClassStorageBuffer) &&
			    is_array(get_variable_data_type(*var)))
			{
				return join("[", get_resource_array_size(type, variable_id), "]");
			}
			else
				return CompilerGLSL::type_to_array_glsl(type, variable_id);
		}
		else
			return "";
	}
}